

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O0

int constructSubscibeTypeVariableHeader(BUFFER_HANDLE ctrlPacket,uint16_t packetId)

{
  int iVar1;
  uchar *local_20;
  uint8_t *iterator;
  int result;
  uint16_t packetId_local;
  BUFFER_HANDLE ctrlPacket_local;
  
  iterator._0_4_ = 0;
  iterator._6_2_ = packetId;
  _result = ctrlPacket;
  iVar1 = BUFFER_enlarge(ctrlPacket,2);
  if (iVar1 == 0) {
    local_20 = BUFFER_u_char(_result);
    if (local_20 == (uchar *)0x0) {
      iterator._0_4_ = 0x126;
    }
    else {
      byteutil_writeInt(&local_20,iterator._6_2_);
      iterator._0_4_ = 0;
    }
  }
  else {
    iterator._0_4_ = 0x11f;
  }
  return (int)iterator;
}

Assistant:

static int constructSubscibeTypeVariableHeader(BUFFER_HANDLE ctrlPacket, uint16_t packetId)
{
    int result = 0;
    if (BUFFER_enlarge(ctrlPacket, 2) != 0)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint8_t* iterator = BUFFER_u_char(ctrlPacket);
        if (iterator == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            byteutil_writeInt(&iterator, packetId);
            result = 0;
        }
    }
    return result;
}